

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void backpressure_check(CManager_conflict cm,EVstone s)

{
  int iVar1;
  stone_type p_Var2;
  int *piVar3;
  int high_threshold;
  int low_threshold;
  int local_28;
  undefined1 local_24 [4];
  
  if (cm->evp->use_backpressure != 0) {
    p_Var2 = stone_struct(cm->evp,s);
    iVar1 = p_Var2->is_stalled;
    _local_28 = 0x32000000c8;
    if (p_Var2->stone_attrs != (attr_list)0x0) {
      if (backpressure_check::EV_BACKPRESSURE_HIGH == -1) {
        backpressure_check::EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
        backpressure_check::EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
      }
      get_int_attr(p_Var2->stone_attrs,backpressure_check::EV_BACKPRESSURE_HIGH,&local_28);
      get_int_attr(p_Var2->stone_attrs,backpressure_check::EV_BACKPRESSURE_LOW,local_24);
    }
    piVar3 = (int *)local_24;
    if (iVar1 == 0) {
      piVar3 = &local_28;
    }
    backpressure_transition(cm,s,Stall_Overload,(uint)(*piVar3 < p_Var2->queue_size));
  }
  return;
}

Assistant:

static void
backpressure_check(CManager cm, EVstone s) {
    if (cm->evp->use_backpressure) {
        stone_type stone = stone_struct(cm->evp, s);
        int old_stalled = stone->is_stalled;
        int low_threshold = 50, high_threshold = 200;
        if (stone->stone_attrs) {
	    static atom_t EV_BACKPRESSURE_HIGH = -1;
	    static atom_t EV_BACKPRESSURE_LOW = -1;
	    if (EV_BACKPRESSURE_HIGH == -1) {
		EV_BACKPRESSURE_HIGH = attr_atom_from_string("EV_BACKPRESSURE_HIGH");
		EV_BACKPRESSURE_LOW = attr_atom_from_string("EV_BACKPRESSURE_LOW");
	    }
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_HIGH, &high_threshold);
            get_int_attr(stone->stone_attrs, EV_BACKPRESSURE_LOW, &low_threshold);
        }
        backpressure_transition(cm, s, Stall_Overload,
            (stone->queue_size > (old_stalled ? low_threshold : high_threshold)));
    }
}